

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O3

void * mi_recalloc_aligned(void *p,size_t newcount,size_t size,size_t alignment)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  long in_FS_OFFSET;
  
  if ((newcount != 1) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = newcount, auVar2._8_8_ = 0, auVar2._0_8_ = size,
     size = SUB168(auVar1 * auVar2,0), SUB168(auVar1 * auVar2,8) != 0)) {
    return (void *)0x0;
  }
  pvVar3 = mi_heap_realloc_zero_aligned(*(mi_heap_t **)(in_FS_OFFSET + -0x58),p,size,alignment,true)
  ;
  return pvVar3;
}

Assistant:

mi_decl_nodiscard void* mi_recalloc_aligned(void* p, size_t newcount, size_t size, size_t alignment) mi_attr_noexcept {
  return mi_heap_recalloc_aligned(mi_prim_get_default_heap(), p, newcount, size, alignment);
}